

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scspdsp.c
# Opt level: O2

void SCSPDSP_Start(SCSPDSP *DSP)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  DSP->Stopped = 0;
  iVar2 = 0x7f;
  uVar3 = 0x1fc;
  while ((((iVar1 = -1, -1 < iVar2 && (iVar1 = iVar2, DSP->MPRO[uVar3] == 0)) &&
          (DSP->MPRO[(ulong)uVar3 + 1] == 0)) &&
         ((DSP->MPRO[(ulong)uVar3 + 2] == 0 && (DSP->MPRO[(ulong)uVar3 + 3] == 0))))) {
    iVar2 = iVar2 + -1;
    uVar3 = uVar3 - 4;
  }
  DSP->LastStep = iVar1 + 1;
  return;
}

Assistant:

void SCSPDSP_Start(SCSPDSP *DSP)
{
	int i;
	DSP->Stopped=0;
	for(i=127;i>=0;--i)
	{
		UINT16 *IPtr=DSP->MPRO+i*4;

		if(IPtr[0]!=0 || IPtr[1]!=0 || IPtr[2]!=0 || IPtr[3]!=0)
			break;
	}
	DSP->LastStep=i+1;

}